

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                 *this)

{
  TPZAbstractFrontMatrix<std::complex<float>_>::TPZAbstractFrontMatrix
            (&this->super_TPZAbstractFrontMatrix<std::complex<float>_>,&PTR_PTR_017b77b8);
  (this->super_TPZAbstractFrontMatrix<std::complex<float>_>).super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFrontMatrix_017b7530;
  TPZStackEqnStorage<std::complex<float>_>::TPZStackEqnStorage(&this->fStorage);
  TPZFrontSym<std::complex<float>_>::TPZFrontSym(&this->fFront);
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fNumElConnected).fNAlloc = 0;
  (this->fNumElConnected).fStore = (int *)0x0;
  (this->fNumElConnected).fNElements = 0;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fNumElConnectedBackup).fStore = (int *)0x0;
  (this->fNumElConnectedBackup).fNElements = 0;
  (this->fNumElConnectedBackup).fNAlloc = 0;
  TPZFrontSym<std::complex<float>_>::Reset(&this->fFront,0);
  TPZStackEqnStorage<std::complex<float>_>::Reset(&this->fStorage);
  TPZVec<int>::Resize(&this->fNumElConnected,0);
  TPZVec<int>::Resize(&this->fNumElConnectedBackup,0);
  this->fLastDecomposed = -1;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}